

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

void QtPrivate::QDebugStreamOperatorForType<QCborValue,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  QCborValue local_20;
  
  local_20._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_20.n = (qint64)dbg->stream;
  ((Stream *)local_20.n)->ref = ((Stream *)local_20.n)->ref + 1;
  ::operator<<((QDebug)&local_20.container,&local_20);
  QDebug::~QDebug((QDebug *)&local_20.container);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20._16_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }